

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FramebufferBase.hpp
# Opt level: O3

ITextureView * __thiscall
Diligent::FramebufferBase<Diligent::EngineVkImplTraits>::GetReadOnlyDSV
          (FramebufferBase<Diligent::EngineVkImplTraits> *this,Uint32 Subpass)

{
  int iVar1;
  undefined4 extraout_var;
  ITextureView *pIVar2;
  char (*in_R8) [19];
  string msg;
  Uint32 local_3c;
  string local_38;
  
  local_3c = Subpass;
  iVar1 = (*(((this->
              super_DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
              ).m_Desc.pRenderPass)->super_IDeviceObject).super_IObject._vptr_IObject[4])();
  if (*(uint *)(CONCAT44(extraout_var,iVar1) + 0x18) <= Subpass) {
    FormatString<char[16],unsigned_int,char[19]>
              (&local_38,(Diligent *)"Subpass index (",(char (*) [16])&local_3c,
               (uint *)") is out of range.",in_R8);
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"GetReadOnlyDSV",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/FramebufferBase.hpp"
               ,199);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  if (this->m_ppReadOnlyDSVs == (ITextureView **)0x0) {
    pIVar2 = (ITextureView *)0x0;
  }
  else {
    pIVar2 = this->m_ppReadOnlyDSVs[local_3c];
  }
  return pIVar2;
}

Assistant:

ITextureView* GetReadOnlyDSV(Uint32 Subpass) const
    {
        VERIFY(Subpass < this->m_Desc.pRenderPass->GetDesc().SubpassCount, "Subpass index (", Subpass, ") is out of range.");
        return m_ppReadOnlyDSVs != nullptr ?
            m_ppReadOnlyDSVs[Subpass] :
            nullptr;
    }